

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

bool duckdb::Date::IsValid(int32_t year,int32_t month,int32_t day)

{
  uint uVar1;
  int *piVar2;
  undefined1 *puVar3;
  
  if (day < 1 || month - 0xdU < 0xfffffff4) {
    return false;
  }
  if (year < -0x59af88) {
    if ((uint)month < 6 || year != -0x59af89) {
      return false;
    }
    if (month == 6 && (uint)day < 0x19) {
      return false;
    }
LAB_002cb955:
    piVar2 = (int *)(NORMAL_DAYS + (ulong)(uint)month * 4);
  }
  else {
    if (year < 0x59beec) {
      if ((year & 3U) != 0) goto LAB_002cb955;
      uVar1 = year * -0x3d70a3d7 + 0x51eb850;
      if ((uVar1 >> 2 | year * 0x40000000) < 0x28f5c29) {
        if ((uVar1 >> 4 | year * -0x70000000) < 0xa3d70b) {
          puVar3 = LEAP_DAYS;
        }
        else {
          puVar3 = NORMAL_DAYS;
        }
        piVar2 = (int *)(puVar3 + (ulong)(uint)month * 4);
        goto LAB_002cb9ab;
      }
    }
    else {
      if (7 < (uint)month || year != 0x59beec) {
        return false;
      }
      if (month == 7 && 10 < (uint)day) {
        return false;
      }
    }
    piVar2 = (int *)(LEAP_DAYS + (ulong)(uint)month * 4);
  }
LAB_002cb9ab:
  return day <= *piVar2;
}

Assistant:

bool Date::IsValid(int32_t year, int32_t month, int32_t day) {
	if (month < 1 || month > 12) {
		return false;
	}
	if (day < 1) {
		return false;
	}
	if (year <= DATE_MIN_YEAR) {
		if (year < DATE_MIN_YEAR) {
			return false;
		} else if (year == DATE_MIN_YEAR) {
			if (month < DATE_MIN_MONTH || (month == DATE_MIN_MONTH && day < DATE_MIN_DAY)) {
				return false;
			}
		}
	}
	if (year >= DATE_MAX_YEAR) {
		if (year > DATE_MAX_YEAR) {
			return false;
		} else if (year == DATE_MAX_YEAR) {
			if (month > DATE_MAX_MONTH || (month == DATE_MAX_MONTH && day > DATE_MAX_DAY)) {
				return false;
			}
		}
	}
	return Date::IsLeapYear(year) ? day <= Date::LEAP_DAYS[month] : day <= Date::NORMAL_DAYS[month];
}